

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O3

Wln_Ntk_t * Wln_ReadNdr(char *pFileName)

{
  void *pData;
  Wln_Ntk_t *pWVar1;
  Ndr_Data_t *p;
  int in_ESI;
  
  pData = Ndr_Read(pFileName);
  if (pData != (void *)0x0) {
    pWVar1 = Wln_NtkFromNdr(pData,in_ESI);
    if (pWVar1 == (Wln_Ntk_t *)0x0) {
      free(*(void **)((long)pData + 8));
      free(*(void **)((long)pData + 0x10));
      free(pData);
    }
  }
  return (Wln_Ntk_t *)0x0;
}

Assistant:

Wln_Ntk_t * Wln_ReadNdr( char * pFileName )
{
    void * pData = Ndr_Read( pFileName );
    Wln_Ntk_t * pNtk = pData ? Wln_NtkFromNdr( pData, 0 ) : NULL;
    if ( pNtk ) return NULL;
    //char * ppNames[10] = { NULL, "a", "b", "c", "d", "e", "f", "g", "h", "i" };
    //Ndr_WriteVerilog( NULL, pData, ppNames );
    Ndr_Delete( pData );
    return pNtk;
}